

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

bool tinyexr::EncodePixelData
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data,uchar **images,
               int compression_type,int param_4,int width,int param_6,int x_stride,int line_no,
               int num_lines,size_t pixel_data_size,
               vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *channels,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *channel_offset_list,
               string *err,void *compression_param)

{
  long *plVar1;
  byte *pbVar2;
  longlong *plVar3;
  longlong *plVar4;
  longlong *plVar5;
  size_t __n;
  undefined1 *puVar6;
  pointer puVar7;
  ushort *puVar8;
  undefined2 uVar9;
  ushort uVar10;
  int i;
  int iVar11;
  uint uVar12;
  unsigned_short *puVar13;
  long *plVar14;
  char *pcVar15;
  uchar *__src;
  ushort *puVar16;
  char *pcVar17;
  pointer pPVar18;
  void *pvVar19;
  void *__s;
  void *__s_00;
  longlong *hcode;
  undefined8 uVar20;
  uint uVar21;
  long lVar22;
  ushort *puVar23;
  long lVar24;
  char cVar25;
  uint uVar26;
  long lVar27;
  char *pcVar28;
  int iVar29;
  int iVar30;
  value_type_conflict3 *__val;
  pointer pPVar31;
  char cVar32;
  uint uVar33;
  value_type_conflict6 *__val_1;
  uint uVar34;
  ulong uVar35;
  undefined1 *puVar36;
  ushort *puVar37;
  uint uVar38;
  int iVar39;
  ulong uVar40;
  long lVar41;
  ushort *puVar42;
  ushort uVar43;
  uint uVar44;
  short bs_1;
  uint uVar45;
  int iVar46;
  long lVar47;
  value_type_conflict4 *__val_3;
  ulong uVar48;
  ulong uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  value_type_conflict7 *__val_2;
  ulong uVar53;
  pointer pPVar54;
  longlong **pplVar55;
  int i_1;
  long lVar56;
  ushort *puVar57;
  longlong **pplVar58;
  bool bVar59;
  undefined4 in_stack_00000014;
  _Iter_comp_iter<tinyexr::FHeapCompare> __cmp;
  undefined4 in_stack_0000001c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block_2;
  allocator_type local_161;
  longlong **local_160;
  ushort *local_158;
  ulong local_150;
  ushort *local_148;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_140;
  ulong local_128;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> local_120;
  long local_108;
  long *local_100;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  pointer local_e0;
  ulong local_d8;
  ulong local_d0;
  void *local_c8;
  int local_bc;
  vector<unsigned_char,std::allocator<unsigned_char>> *local_b8;
  long local_b0;
  pointer local_a8;
  ulong local_a0;
  long local_98;
  ushort *local_90;
  uint local_88;
  uint local_84;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  void *local_68;
  ushort *local_60;
  long local_58;
  pointer local_50;
  longlong **local_48;
  ulong local_40;
  longlong **local_38;
  
  local_c8 = (void *)CONCAT44(local_c8._4_4_,compression_type);
  local_160 = (longlong **)(long)x_stride;
  pPVar18 = (pointer)CONCAT44(in_stack_0000001c,num_lines);
  lVar56 = (long)param_4;
  local_b8 = (vector<unsigned_char,std::allocator<unsigned_char>> *)out_data;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_f8,(long)local_160 * lVar56 * CONCAT44(in_stack_00000014,line_no),
             (allocator_type *)&local_140);
  puVar13 = pPVar18->start;
  if (pPVar18->end != puVar13) {
    lVar27 = (long)width;
    uVar53 = (ulong)local_160 & 0xffffffff;
    uVar48 = (ulong)(uint)param_4;
    local_100 = (long *)(param_6 * lVar27 * 4);
    lVar41 = lVar27 * 4;
    local_108 = param_6 * lVar27 * 2;
    local_128 = lVar27 * 2;
    uVar49 = 0;
    local_158 = (ushort *)CONCAT44(local_158._4_4_,param_4);
    do {
      lVar27 = CONCAT44(in_stack_00000014,line_no);
      iVar11 = *(int *)(puVar13 + uVar49 * 0x1c + 0x10);
      if (iVar11 == 2) {
        if (*(int *)(puVar13 + uVar49 * 0x1c + 0x12) == 1) {
          if (0 < (int)local_160) {
            lVar27 = 0;
            uVar40 = 0;
            plVar14 = local_100;
            do {
              lVar24 = *(long *)(*(long *)pixel_data_size + uVar49 * 8);
              pPVar31 = (pointer)CONCAT44(local_f8.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                          (int)local_f8.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start);
              if ((ulong)(CONCAT44(local_f8.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)local_f8.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) - (long)pPVar31)
                  <= (uVar40 * CONCAT44(in_stack_00000014,line_no) + lVar24) * lVar56)
              goto LAB_001a1c31;
              pPVar18 = pPVar31;
              if (0 < param_4) {
                lVar24 = (lVar24 + lVar27) * lVar56;
                uVar35 = 0;
                do {
                  uVar12 = *(uint *)(images[uVar49] + (long)plVar14 + uVar35 * 4);
                  uVar26 = uVar12 >> 0x17;
                  uVar33 = uVar26 & 0xff;
                  if ((char)uVar26 != '\0') {
                    if (uVar33 == 0xff) {
                      uVar33 = ((uVar12 & 0x7fffff) != 0 | 0x3e) << 9;
                    }
                    else {
                      uVar21 = 0x7c00;
                      if (uVar33 < 0x8f) {
                        if (uVar33 < 0x71) {
                          uVar21 = 0;
                          if (uVar33 < 0x66) goto LAB_001a0566;
                          uVar44 = uVar12 & 0x7fffff | 0x800000;
                          uVar21 = uVar44 >> (0x7eU - (char)uVar26 & 0x1f) & 0x3ff;
                          uVar44 = uVar44 >> (0x7d - uVar33 & 0x1f);
                        }
                        else {
                          uVar21 = (uVar12 >> 0xd & 0x3ff | (uVar26 & 0x1f) << 10) ^ 0x4000;
                          uVar44 = uVar12 >> 0xc;
                        }
                        uVar21 = uVar21 + ((uVar44 & 1) != 0);
                      }
LAB_001a0566:
                      uVar33 = uVar21 & 0x7fff;
                    }
                  }
                  uVar12 = uVar12 >> 0x10 & 0x8000 | uVar33;
                  pPVar18 = (pointer)(ulong)uVar12;
                  *(char *)((long)&pPVar31->start + uVar35 * 2 + lVar24) = (char)uVar33;
                  *(char *)((long)&pPVar31->start + uVar35 * 2 + lVar24 + 1) = (char)(uVar12 >> 8);
                  uVar35 = uVar35 + 1;
                } while (uVar48 != uVar35);
              }
              uVar40 = uVar40 + 1;
              lVar27 = lVar27 + CONCAT44(in_stack_00000014,line_no);
              plVar14 = (long *)((long)plVar14 + lVar41);
            } while (uVar40 != uVar53);
          }
        }
        else {
          if (*(int *)(puVar13 + uVar49 * 0x1c + 0x12) != 2) {
LAB_001a09d8:
            if (channels !=
                (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)0x0) {
              std::__cxx11::string::append((char *)channels);
            }
            goto LAB_001a1737;
          }
          if (0 < (int)local_160) {
            lVar27 = 0;
            uVar40 = 0;
            plVar14 = local_100;
            do {
              lVar24 = *(long *)(*(long *)pixel_data_size + uVar49 * 8);
              pPVar18 = (pointer)CONCAT44(local_f8.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                          (int)local_f8.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start);
              if ((ulong)(CONCAT44(local_f8.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)local_f8.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) - (long)pPVar18)
                  <= (uVar40 * CONCAT44(in_stack_00000014,line_no) + lVar24) * lVar56)
              goto LAB_001a1c23;
              if (0 < param_4) {
                uVar35 = 0;
                do {
                  *(undefined4 *)((long)&pPVar18->start + uVar35 * 4 + (lVar24 + lVar27) * lVar56) =
                       *(undefined4 *)(images[uVar49] + (long)plVar14 + uVar35 * 4);
                  uVar35 = uVar35 + 1;
                } while (uVar48 != uVar35);
              }
              uVar40 = uVar40 + 1;
              lVar27 = lVar27 + CONCAT44(in_stack_00000014,line_no);
              plVar14 = (long *)((long)plVar14 + lVar41);
            } while (uVar40 != uVar53);
          }
        }
      }
      else if (iVar11 == 1) {
        if (*(int *)(puVar13 + uVar49 * 0x1c + 0x12) == 2) {
          if (0 < (int)local_160) {
            lVar22 = 0;
            uVar40 = 0;
            lVar24 = local_108;
            do {
              lVar47 = *(long *)(*(long *)pixel_data_size + uVar49 * 8);
              pPVar31 = (pointer)CONCAT44(local_f8.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                          (int)local_f8.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start);
              if ((ulong)(CONCAT44(local_f8.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)local_f8.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) - (long)pPVar31)
                  <= (uVar40 * lVar27 + lVar47) * lVar56) goto LAB_001a1c3f;
              pPVar18 = pPVar31;
              if (0 < param_4) {
                lVar47 = (lVar47 + lVar22) * lVar56;
                uVar35 = 0;
                do {
                  uVar10 = *(ushort *)(images[uVar49] + uVar35 * 2 + lVar24);
                  uVar12 = (uint)uVar10 << 0xd;
                  if ((uVar12 & 0xf800000) == 0xf800000) {
                    pPVar18 = (pointer)(ulong)(uVar12 | 0x70000000);
                  }
                  else if ((uVar12 & 0xf800000) == 0) {
                    pPVar18 = (pointer)(ulong)(uint)((float)(uVar12 | 0x38800000) + -6.1035156e-05);
                  }
                  else {
                    pPVar18 = (pointer)(ulong)((uVar12 & 0xfffe000) + 0x38000000);
                  }
                  *(char *)((long)&pPVar31->start + uVar35 * 4 + lVar47) = (char)pPVar18;
                  *(char *)((long)&pPVar31->start + uVar35 * 4 + lVar47 + 1) =
                       (char)((ulong)pPVar18 >> 8);
                  *(char *)((long)&pPVar31->start + uVar35 * 4 + lVar47 + 2) =
                       (char)((ulong)pPVar18 >> 0x10);
                  *(byte *)((long)&pPVar31->start + uVar35 * 4 + lVar47 + 3) =
                       (byte)((short)uVar10 >> 0xf) & 0x80 | (byte)((ulong)pPVar18 >> 0x18);
                  uVar35 = uVar35 + 1;
                } while (uVar48 != uVar35);
              }
              uVar40 = uVar40 + 1;
              lVar22 = lVar22 + lVar27;
              lVar24 = lVar24 + local_128;
            } while (uVar40 != uVar53);
          }
        }
        else {
          if (*(int *)(puVar13 + uVar49 * 0x1c + 0x12) != 1) goto LAB_001a09d8;
          if (0 < (int)local_160) {
            lVar22 = 0;
            uVar40 = 0;
            lVar24 = local_108;
            do {
              lVar47 = *(long *)(*(long *)pixel_data_size + uVar49 * 8);
              pPVar18 = (pointer)CONCAT44(local_f8.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                          (int)local_f8.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start);
              if ((ulong)(CONCAT44(local_f8.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)local_f8.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) - (long)pPVar18)
                  <= (uVar40 * lVar27 + lVar47) * lVar56) goto LAB_001a1c4d;
              if (0 < param_4) {
                uVar35 = 0;
                do {
                  *(undefined2 *)((long)&pPVar18->start + uVar35 * 2 + (lVar47 + lVar22) * lVar56) =
                       *(undefined2 *)(images[uVar49] + uVar35 * 2 + lVar24);
                  uVar35 = uVar35 + 1;
                } while (uVar48 != uVar35);
              }
              uVar40 = uVar40 + 1;
              lVar22 = lVar22 + lVar27;
              lVar24 = lVar24 + local_128;
            } while (uVar40 != uVar53);
          }
        }
      }
      else if ((iVar11 == 0) && (0 < (int)local_160)) {
        lVar27 = 0;
        uVar40 = 0;
        plVar14 = local_100;
        do {
          lVar24 = *(long *)(*(long *)pixel_data_size + uVar49 * 8);
          pPVar18 = (pointer)CONCAT44(local_f8.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                      (int)local_f8.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
          if ((ulong)(CONCAT44(local_f8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,
                               (int)local_f8.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish) - (long)pPVar18) <=
              (uVar40 * CONCAT44(in_stack_00000014,line_no) + lVar24) * lVar56) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
            goto LAB_001a1c23;
          }
          if (0 < param_4) {
            uVar35 = 0;
            do {
              *(undefined4 *)((long)&pPVar18->start + uVar35 * 4 + (lVar24 + lVar27) * lVar56) =
                   *(undefined4 *)(images[uVar49] + (long)plVar14 + uVar35 * 4);
              uVar35 = uVar35 + 1;
            } while (uVar48 != uVar35);
          }
          uVar40 = uVar40 + 1;
          lVar27 = lVar27 + CONCAT44(in_stack_00000014,line_no);
          plVar14 = (long *)((long)plVar14 + lVar41);
        } while (uVar40 != uVar53);
      }
      uVar49 = uVar49 + 1;
      puVar13 = *(unsigned_short **)CONCAT44(in_stack_0000001c,num_lines);
    } while (uVar49 < (ulong)((((long *)CONCAT44(in_stack_0000001c,num_lines))[1] - (long)puVar13 >>
                              3) * 0x6db6db6db6db6db7));
  }
  if ((uint)local_c8 == 0) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (local_b8,*(undefined8 *)(local_b8 + 8),
               CONCAT44(local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                        (int)local_f8.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start),
               CONCAT44(local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish._4_4_,
                        (int)local_f8.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish));
LAB_001a1bed:
    bVar59 = true;
    goto LAB_001a1bef;
  }
  if (((uint)local_c8 & 0xfffffffe) == 2) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_120,
               (CONCAT44(local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish._4_4_,
                         (int)local_f8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish) -
               CONCAT44(local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                        (int)local_f8.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start)) * 2 + 0x100,
               (allocator_type *)&local_140);
    pPVar18 = local_120.
              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pPVar31 = (pointer)((long)local_120.
                              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_120.
                             super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                             ._M_impl.super__Vector_impl_data._M_start);
    images = (uchar **)pPVar31;
    if (pPVar31 == (pointer)0x0) {
LAB_001a1c5e:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
                 images);
      pPVar31 = (pointer)images;
LAB_001a1c71:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_001a1c83:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    else {
      pvVar19 = (void *)CONCAT44(local_f8.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (int)local_f8.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
      puVar6 = (undefined1 *)
               CONCAT44(local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish._4_4_,
                        (int)local_f8.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish);
      images = (uchar **)(puVar6 + -(long)pvVar19);
      if ((pointer)images == (pointer)0x0) goto LAB_001a1c5e;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_140,(size_type)images,(allocator_type *)&local_80);
      if (local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) goto LAB_001a1c71;
      if (0 < (long)images) {
        lVar56 = 0;
        do {
          puVar36 = (undefined1 *)(lVar56 * 2 + 1 + (long)pvVar19);
          *(undefined1 *)
           ((long)local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start + lVar56) = puVar36[-1];
          if (puVar6 <= puVar36) break;
          *(undefined1 *)
           ((long)local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start +
           lVar56 + ((ulong)((long)&((pointer)images)->start + 1U) >> 1)) = *puVar36;
          lVar56 = lVar56 + 1;
        } while (puVar36 + 1 < puVar6);
      }
      if (local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) goto LAB_001a1c83;
      if (1 < (long)images) {
        pcVar15 = (char *)((long)local_140.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 1);
        cVar25 = *local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          cVar32 = *pcVar15;
          *pcVar15 = (cVar32 - cVar25) + -0x80;
          pcVar15 = pcVar15 + 1;
          cVar25 = cVar32;
        } while (pcVar15 < (char *)((long)local_140.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start + (long)images))
        ;
      }
      if (local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        __src = stbi_zlib_compress(local_140.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,(int)images,
                                   (int *)&local_80,8);
        if (__src != (uchar *)0x0) {
          memcpy(pPVar18,__src,
                 (long)(int)local_80.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          free(__src);
          pPVar31 = (pointer)(long)(int)local_80.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
          if (images <= (pointer)(long)(int)local_80.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start) {
            memcpy(pPVar18,pvVar19,(size_t)images);
            pPVar31 = (pointer)images;
          }
        }
        if ((ushort *)
            local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (ushort *)0x0) {
          operator_delete(local_140.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (__src == (uchar *)0x0) {
          if (channels !=
              (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)0x0) {
            std::__cxx11::string::append((char *)channels);
          }
        }
        else {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    (local_b8,*(undefined8 *)(local_b8 + 8),
                     local_120.
                     super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (undefined1 *)
                     ((long)&(local_120.
                              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                              ._M_impl.super__Vector_impl_data._M_start)->start +
                     ((ulong)pPVar31 & 0xffffffff)));
        }
        if (local_120.
            super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_120.
                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (__src != (uchar *)0x0) goto LAB_001a1bed;
        goto LAB_001a1737;
      }
    }
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    local_120.super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
    _M_impl.super__Vector_impl_data._M_start = pPVar31;
LAB_001a1ca7:
    uVar53 = 0;
    pPVar18 = local_120.
              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
              _M_impl.super__Vector_impl_data._M_start;
LAB_001a1caa:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,uVar53)
    ;
LAB_001a1cbd:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_001a1ccf:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_001a1ce1:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_001a1cf3:
    local_150 = 0;
LAB_001a1cfc:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
               local_150);
LAB_001a1d11:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_001a1d23:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,pPVar18
              );
  }
  else {
    if ((uint)local_c8 == 0x80) {
      if (channels != (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)0x0)
      {
        std::__cxx11::string::append((char *)channels);
      }
LAB_001a1737:
      bVar59 = false;
LAB_001a1bef:
      if ((void *)CONCAT44(local_f8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           (int)local_f8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_f8.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (int)local_f8.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start));
      }
      return bVar59;
    }
    if ((uint)local_c8 != 4) {
      if ((uint)local_c8 != 1) goto LAB_001a1737;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_120,
                 (ulong)((CONCAT44(local_f8.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)local_f8.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) -
                         CONCAT44(local_f8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (int)local_f8.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)) * 3) >> 1,
                 (allocator_type *)&local_140);
      pPVar18 = local_120.
                super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_120.
          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_120.
          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
          _M_impl.super__Vector_impl_data._M_start) goto LAB_001a1ca7;
      pcVar15 = (char *)CONCAT44(local_f8.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (int)local_f8.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
      pcVar17 = (char *)CONCAT44(local_f8.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                 (int)local_f8.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish);
      uVar53 = (long)pcVar17 - (long)pcVar15;
      if (uVar53 == 0) goto LAB_001a1caa;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_140,uVar53,(allocator_type *)&local_80);
      if (local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) goto LAB_001a1cbd;
      if (0 < (long)uVar53) {
        puVar16 = (ushort *)
                  local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pcVar28 = pcVar15;
        do {
          *(char *)puVar16 = *pcVar28;
          if (pcVar17 <= pcVar28 + 1) break;
          *(char *)((long)puVar16 + (uVar53 + 1 >> 1)) = pcVar28[1];
          puVar16 = (ushort *)((long)puVar16 + 1);
          pcVar28 = pcVar28 + 2;
        } while (pcVar28 < pcVar17);
      }
      if (local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) goto LAB_001a1ccf;
      if (1 < (long)uVar53) {
        pcVar17 = (char *)((long)local_140.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 1);
        cVar25 = *local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          cVar32 = *pcVar17;
          *pcVar17 = (cVar32 - cVar25) + -0x80;
          pcVar17 = pcVar17 + 1;
          cVar25 = cVar32;
        } while (pcVar17 < (char *)((long)local_140.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start + uVar53));
      }
      if (local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        pPVar31 = pPVar18;
        if (0 < (int)uVar53) {
          puVar23 = (ushort *)
                    ((long)(int)uVar53 +
                    (long)local_140.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
          puVar16 = (ushort *)
                    local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          puVar57 = (ushort *)
                    local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
LAB_001a08de:
          puVar42 = (ushort *)((long)puVar16 + 3);
          puVar8 = (ushort *)((long)puVar16 + 1);
          pcVar17 = (char *)(~(ulong)puVar16 + (long)puVar57);
          lVar56 = ((long)puVar16 + 1) - (long)puVar57;
          cVar25 = (char)puVar16 - (char)puVar57;
          do {
            cVar32 = cVar25;
            lVar41 = lVar56;
            pcVar28 = pcVar17;
            puVar16 = puVar8;
            puVar37 = puVar42;
            if ((puVar23 <= puVar16) || ((long)pcVar28 < -0x7f)) break;
            puVar42 = (ushort *)((long)puVar37 + 1);
            puVar8 = (ushort *)((long)puVar16 + 1);
            pcVar17 = pcVar28 + -1;
            lVar56 = lVar41 + 1;
            cVar25 = cVar32 + '\x01';
          } while ((char)*puVar57 == (char)*puVar16);
          if (pcVar28 == (char *)0xfffffffffffffffe || -(long)pcVar28 < 2) {
            if (puVar16 < puVar23) {
              do {
                if ((((ushort *)((long)puVar37 - 1U) < puVar23) &&
                    ((char)puVar37[-1] == *(char *)((long)puVar37 + -1))) && (puVar37 < puVar23)) {
                  if ((0x7e < lVar41) || (*(char *)((long)puVar37 + -1) == (char)*puVar37))
                  goto LAB_001a09d2;
                }
                else if ((puVar23 <= (ushort *)((long)puVar37 - 1U)) || (0x7e < lVar41)) {
                  puVar16 = (ushort *)((long)puVar37 + ~(ulong)(0x7e < lVar41));
                  break;
                }
                puVar37 = (ushort *)((long)puVar37 + 1);
                lVar41 = lVar41 + 1;
              } while( true );
            }
            goto LAB_001a099d;
          }
          *(char *)&pPVar31->start = cVar32;
          *(char *)((long)&pPVar31->start + 1) = (char)*puVar57;
          pPVar31 = (pointer)((long)&pPVar31->start + 2);
          puVar57 = puVar16;
          goto LAB_001a09c4;
        }
LAB_001a173e:
        uVar48 = (ulong)((int)pPVar31 - (int)pPVar18);
        if (uVar53 <= uVar48) {
          memcpy(pPVar18,pcVar15,uVar53);
          uVar48 = uVar53;
        }
        if ((ushort *)
            local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (ushort *)0x0) {
          operator_delete(local_140.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (local_b8,*(undefined8 *)(local_b8 + 8),
                   local_120.
                   super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (undefined1 *)
                   ((long)&(local_120.
                            super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                            ._M_impl.super__Vector_impl_data._M_start)->start +
                   (uVar48 & 0xffffffff)));
        goto LAB_001a1be3;
      }
      goto LAB_001a1ce1;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_80,
               (ulong)(((int)local_f8.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (int)local_f8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start) * 2 + 0x2000),
               (allocator_type *)&local_140);
    local_60 = (ushort *)
               CONCAT44(local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                        (int)local_80.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    if ((ushort *)
        local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == local_60) goto LAB_001a1cf3;
    local_68 = (void *)CONCAT44(local_f8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                (int)local_f8.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
    uVar53 = CONCAT44(local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish._4_4_,
                      (int)local_f8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish) - (long)local_68;
    local_150 = uVar53;
    if (uVar53 == 0) goto LAB_001a1cfc;
    pPVar18 = (pointer)operator_new(0x2000);
    memset(pPVar18,0,0x2000);
    local_e0 = pPVar18;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_140,uVar53 >> 1,
               (allocator_type *)&local_120);
    plVar14 = (long *)CONCAT44(in_stack_0000001c,num_lines);
    std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::vector
              (&local_120,(plVar14[1] - *plVar14 >> 3) * 0x6db6db6db6db6db7,&local_161);
    if (local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) goto LAB_001a1d11;
    iVar11 = (int)local_160;
    if (local_120.
        super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_120.
        super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      lVar56 = 0x24;
      lVar41 = 0x1c;
      uVar53 = 0;
      puVar16 = (ushort *)
                local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        *(ushort **)
         ((long)local_120.
                super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar41 + -0x1c) = puVar16;
        *(ushort **)
         ((long)local_120.
                super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar41 + -0x14) = puVar16;
        *(int *)((long)local_120.
                       super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar41 + -0xc) = param_4;
        *(int *)((long)local_120.
                       super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar41 + -8) = iVar11;
        bVar59 = *(int *)(*plVar14 + lVar56) != 1;
        *(uint *)((long)&(local_120.
                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                          ._M_impl.super__Vector_impl_data._M_start)->start + lVar41) = bVar59 + 1;
        puVar16 = puVar16 + (iVar11 * param_4 << bVar59);
        uVar53 = uVar53 + 1;
        lVar56 = lVar56 + 0x38;
        lVar41 = lVar41 + 0x20;
      } while (uVar53 < (ulong)((long)local_120.
                                      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_120.
                                      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    if (0 < iVar11) {
      iVar11 = 0;
      pvVar19 = local_68;
      do {
        if (local_120.
            super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_120.
            super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          lVar56 = 8;
          uVar53 = 0;
          do {
            pPVar18 = local_120.
                      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar41 = (long)*(int *)((long)&(local_120.
                                            super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->ny + lVar56)
                     * (long)*(int *)((long)&(local_120.
                                              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->end +
                                     lVar56);
            __n = lVar41 * 2;
            memcpy(*(void **)((long)&(local_120.
                                      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->start + lVar56),
                   pvVar19,__n);
            plVar14 = (long *)((long)&pPVar18->start + lVar56);
            *plVar14 = *plVar14 + __n;
            pvVar19 = (void *)((long)pvVar19 + lVar41 * 2);
            uVar53 = uVar53 + 1;
            lVar56 = lVar56 + 0x20;
          } while (uVar53 < (ulong)((long)local_120.
                                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_120.
                                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        iVar11 = iVar11 + 1;
      } while (iVar11 != (int)local_160);
    }
    pPVar31 = local_e0;
    puVar7 = local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pPVar18 = (pointer)((long)local_140.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_140.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 1);
    if (local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) goto LAB_001a1d23;
    memset(local_e0,0,0x2000);
    uVar53 = local_150;
    if (0 < (int)(uint)pPVar18) {
      uVar48 = 0;
      do {
        pbVar2 = (byte *)((long)&pPVar31->start +
                         (ulong)(*(ushort *)((long)puVar7 + uVar48 * 2) >> 3));
        *pbVar2 = *pbVar2 | (byte)(1 << ((byte)*(ushort *)((long)puVar7 + uVar48 * 2) & 7));
        uVar48 = uVar48 + 1;
      } while (((uint)pPVar18 & 0x7fffffff) != uVar48);
    }
    *(byte *)&pPVar31->start = *(byte *)&pPVar31->start & 0xfe;
    pPVar54 = (pointer)0x1fff;
    pPVar18 = (pointer)0x0;
    pPVar31 = (pointer)0x0;
    do {
      if (*(char *)((long)&pPVar31->start + (long)&local_e0->start) != '\0') {
        pPVar54 = (pointer)((ulong)pPVar54 & 0xffff);
        if (pPVar31 < pPVar54) {
          pPVar54 = (pointer)((ulong)pPVar31 & 0xffffffff);
        }
        pPVar18 = (pointer)((ulong)pPVar18 & 0xffff);
        if (pPVar18 < pPVar31) {
          pPVar18 = (pointer)((ulong)pPVar31 & 0xffffffff);
        }
      }
      pPVar31 = (pointer)((long)&pPVar31->start + 1);
    } while (pPVar31 != (pointer)0x2000);
    pvVar19 = operator_new(0x20000);
    uVar48 = 0;
    memset(pvVar19,0,0x20000);
    local_d8 = 0;
    do {
      if ((uVar48 == 0) ||
         ((*(byte *)((long)&local_e0->start + (uVar48 >> 3 & 0x1fffffff)) >> ((uint)uVar48 & 7) & 1)
          != 0)) {
        uVar9 = (undefined2)local_d8;
        local_d8 = (ulong)((int)local_d8 + 1);
      }
      else {
        uVar9 = 0;
      }
      *(undefined2 *)((long)pvVar19 + uVar48 * 2) = uVar9;
      uVar48 = uVar48 + 1;
    } while (uVar48 != 0x10000);
    local_c8 = pvVar19;
    if (local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar12 = (uint)((long)local_140.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_140.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 1);
      if (0 < (int)uVar12) {
        uVar48 = 0;
        do {
          *(ushort *)
           ((long)local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar48 * 2) =
               *(ushort *)
                ((long)pvVar19 +
                (ulong)*(ushort *)
                        ((long)local_140.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + uVar48 * 2) * 2);
          uVar48 = uVar48 + 1;
        } while ((uVar12 & 0x7fffffff) != uVar48);
      }
      *local_60 = (ushort)pPVar54;
      local_60[1] = (ushort)pPVar18;
      puVar16 = local_60 + 2;
      if ((ushort)pPVar54 <= (ushort)pPVar18) {
        lVar56 = ((ulong)pPVar18 & 0xffff) - ((ulong)pPVar54 & 0xffff);
        memcpy(puVar16,(undefined1 *)((long)&local_e0->start + ((ulong)pPVar54 & 0xffff)),lVar56 + 1
              );
        puVar16 = (ushort *)((long)puVar16 + lVar56 + 1);
      }
      if (local_120.
          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_120.
          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        uVar12 = (int)local_d8 - 1;
        local_d8 = (ulong)uVar12;
        uVar48 = 0;
        do {
          local_40 = uVar48;
          local_d0 = (ulong)(uint)local_120.
                                  super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                  ._M_impl.super__Vector_impl_data._M_start[local_40].size;
          if (0 < local_120.
                  super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_40].size) {
            local_50 = local_120.
                       super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                       ._M_impl.super__Vector_impl_data._M_start + local_40;
            local_58 = 0;
            local_98 = 0;
            do {
              uVar26 = local_50->nx;
              uVar33 = local_50->ny;
              local_128 = CONCAT44(local_128._4_4_,uVar26);
              local_84 = uVar33;
              if ((int)uVar26 < (int)uVar33) {
                local_84 = uVar26;
              }
              if (1 < (int)local_84) {
                local_48 = (longlong **)(local_50->start + local_98);
                local_bc = uVar26 * (int)local_d0;
                local_38 = (longlong **)((long)local_50->start + local_58);
                pPVar18 = (pointer)0x2;
                uVar21 = 1;
                do {
                  local_a8 = pPVar18;
                  uVar44 = (uint)local_a8;
                  iVar11 = (uVar33 - uVar44) * local_bc;
                  local_b0 = (long)(int)(uVar21 * (int)local_d0);
                  local_148 = (ushort *)(long)(int)(uVar44 * (int)local_d0);
                  uVar38 = uVar12 & 0xffff;
                  pplVar55 = local_48;
                  if (-1 < iVar11) {
                    local_160 = (longlong **)((long)local_48 + (long)iVar11 * 2);
                    iVar11 = (uVar26 - uVar44) * (int)local_d0;
                    local_100 = (long *)CONCAT44(local_100._4_4_,iVar11);
                    local_a0 = (ulong)iVar11;
                    lVar24 = (long)(int)(uVar21 * local_bc);
                    local_108 = (long)(int)(uVar44 * local_bc) * 2;
                    lVar27 = lVar24 * 2;
                    lVar41 = local_b0 * 2;
                    lVar56 = lVar41 + lVar24 * 2;
                    pplVar55 = local_38;
                    do {
                      pplVar58 = pplVar55;
                      if (-1 < iVar11) {
                        do {
                          uVar50 = (uint)*(short *)pplVar58;
                          uVar10 = *(ushort *)((long)pplVar58 + lVar41);
                          if (uVar38 < 0x4000) {
                            iVar29 = uVar50 - (int)(short)uVar10;
                            iVar46 = (int)*(short *)((long)pplVar58 + lVar27) -
                                     (int)*(short *)((long)pplVar58 + lVar56);
                            uVar50 = (int)(short)uVar10 + uVar50;
                            uVar34 = (int)*(short *)((long)pplVar58 + lVar56) +
                                     (int)*(short *)((long)pplVar58 + lVar27);
                            *(short *)pplVar58 =
                                 (short)((uint)(((int)uVar50 >> 1) + ((int)uVar34 >> 1)) >> 1);
                            *(short *)((long)pplVar58 + lVar27) =
                                 (short)(uVar50 >> 1) - (short)(uVar34 >> 1);
                            iVar30 = iVar29 - iVar46;
                            *(short *)((long)pplVar58 + lVar41) =
                                 (short)((uint)((int)(short)iVar29 + (int)(short)iVar46) >> 1);
                          }
                          else {
                            uVar51 = (uVar50 ^ 0x8000) & 0xffff;
                            uVar52 = uVar51 - uVar10;
                            uVar50 = *(ushort *)((long)pplVar58 + lVar27) ^ 0x8000;
                            uVar34 = uVar50 - *(ushort *)((long)pplVar58 + lVar56);
                            uVar45 = uVar34 >> 0x10 & 0x8000 ^
                                     *(ushort *)((long)pplVar58 + lVar56) + uVar50 >> 1;
                            uVar50 = uVar51 + uVar10 >> 1 ^ 0x8000 ^ uVar52 >> 0x10 & 0x8000;
                            iVar30 = uVar50 - uVar45;
                            *(ushort *)pplVar58 =
                                 (ushort)((uint)iVar30 >> 0x10) & 0x8000 ^
                                 (ushort)(uVar45 + uVar50 >> 1);
                            *(short *)((long)pplVar58 + lVar27) = (short)iVar30;
                            uVar50 = uVar52 & 0xffff ^ 0x8000;
                            uVar34 = uVar34 & 0xffff;
                            iVar30 = uVar50 - uVar34;
                            *(ushort *)((long)pplVar58 + lVar41) =
                                 (ushort)((uint)iVar30 >> 0x10) & 0x8000 ^
                                 (ushort)(uVar50 + uVar34 >> 1);
                          }
                          *(short *)((long)pplVar58 + lVar56) = (short)iVar30;
                          pplVar58 = (longlong **)((long)pplVar58 + (long)local_148 * 2);
                        } while (pplVar58 <= (longlong **)((long)pplVar55 + local_a0 * 2));
                      }
                      if ((uVar26 & uVar21) != 0) {
                        uVar50 = (uint)*(short *)pplVar58;
                        uVar10 = *(ushort *)((long)pplVar58 + lVar24 * 2);
                        if (uVar38 < 0x4000) {
                          uVar43 = (ushort)((int)(short)uVar10 + uVar50 >> 1);
                          iVar30 = uVar50 - (int)(short)uVar10;
                        }
                        else {
                          uVar50 = (uVar50 ^ 0x8000) & 0xffff;
                          iVar30 = uVar50 - uVar10;
                          uVar43 = (ushort)((uint)iVar30 >> 0x10) & 0x8000 ^
                                   (ushort)(uVar50 + uVar10 >> 1);
                        }
                        *(short *)((long)pplVar58 + lVar24 * 2) = (short)iVar30;
                        *(ushort *)pplVar58 = uVar43;
                      }
                      pplVar55 = (longlong **)((long)pplVar55 + local_108);
                      pvVar19 = local_c8;
                    } while (pplVar55 <= local_160);
                  }
                  if (((uVar21 & uVar33) != 0) &&
                     (iVar11 = (uVar26 - uVar44) * (int)local_d0, -1 < iVar11)) {
                    pplVar58 = (longlong **)((long)pplVar55 + (long)iVar11 * 2);
                    local_148 = (ushort *)((long)local_148 * 2);
                    do {
                      uVar21 = (uint)*(short *)pplVar55;
                      uVar10 = *(ushort *)((long)pplVar55 + local_b0 * 2);
                      if (uVar38 < 0x4000) {
                        uVar43 = (ushort)((int)(short)uVar10 + uVar21 >> 1);
                        iVar11 = uVar21 - (int)(short)uVar10;
                      }
                      else {
                        uVar21 = (uVar21 ^ 0x8000) & 0xffff;
                        iVar11 = uVar21 - uVar10;
                        uVar43 = (ushort)((uint)iVar11 >> 0x10) & 0x8000 ^
                                 (ushort)(uVar21 + uVar10 >> 1);
                      }
                      *(short *)((long)pplVar55 + local_b0 * 2) = (short)iVar11;
                      *(ushort *)pplVar55 = uVar43;
                      pplVar55 = (longlong **)((long)pplVar55 + (long)local_148);
                    } while (pplVar55 <= pplVar58);
                  }
                  pPVar18 = (pointer)(ulong)(uVar44 * 2);
                  uVar53 = local_150;
                  uVar21 = uVar44;
                  local_88 = uVar33;
                } while ((int)(uVar44 * 2) <= (int)local_84);
              }
              local_98 = local_98 + 1;
              local_d0 = (ulong)local_50->size;
              local_58 = local_58 + 2;
            } while (local_98 < (long)local_d0);
          }
          uVar48 = local_40 + 1;
        } while (local_40 + 1 <
                 (ulong)((long)local_120.
                               super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_120.
                               super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      puVar16[0] = 0;
      puVar16[1] = 0;
      pPVar18 = (pointer)((long)local_140.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_140.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 1);
      local_158 = (ushort *)
                  local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      local_90 = puVar16;
      if (local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) goto LAB_001a1d46;
      local_148 = puVar16 + 2;
      uVar12 = (uint)pPVar18;
      if (uVar12 == 0) {
        iVar30 = 0;
        iVar11 = (int)local_148;
      }
      else {
        __s = operator_new(0x80008);
        memset(__s,0,0x80008);
        if (0 < (int)uVar12) {
          uVar53 = 0;
          do {
            plVar14 = (long *)((long)__s + (ulong)local_158[uVar53] * 8);
            *plVar14 = *plVar14 + 1;
            uVar53 = uVar53 + 1;
          } while ((uVar12 & 0x7fffffff) != uVar53);
        }
        local_a8 = pPVar18;
        __s_00 = operator_new(0x40004);
        memset(__s_00,0,0x40004);
        pplVar55 = (longlong **)operator_new(0x80008);
        memset(pplVar55,0,0x80008);
        plVar14 = (long *)((long)__s + -8);
        local_a0 = 0xffffffffffffffff;
        do {
          local_a0 = local_a0 + 1;
          plVar1 = plVar14 + 1;
          plVar14 = plVar14 + 1;
        } while (*plVar1 == 0);
        iVar11 = 0;
        iVar30 = 0;
        if (local_a0 < 0x10001) {
          uVar48 = 0;
          iVar30 = 0;
          uVar53 = local_a0;
          do {
            *(int *)((long)__s_00 + uVar53 * 4) = (int)uVar53;
            if (*plVar14 != 0) {
              pplVar55[iVar30] = plVar14;
              iVar30 = iVar30 + 1;
              uVar48 = uVar53 & 0xffffffff;
            }
            iVar11 = (int)uVar48;
            uVar53 = uVar53 + 1;
            plVar14 = plVar14 + 1;
          } while (uVar53 != 0x10001);
        }
        local_b0 = CONCAT44(local_b0._4_4_,iVar11);
        local_108 = (long)iVar11;
        local_100 = (long *)((long)__s + local_108 * 8 + 8);
        *(undefined8 *)((long)__s + local_108 * 8 + 8) = 1;
        pplVar55[iVar30] = local_100;
        std::__make_heap<long_long**,__gnu_cxx::__ops::_Iter_comp_iter<tinyexr::FHeapCompare>>
                  (pplVar55,pplVar55 + (long)iVar30 + 1,
                   (_Iter_comp_iter<tinyexr::FHeapCompare> *)&local_161);
        hcode = (longlong *)operator_new(0x80008);
        memset(hcode,0,0x80008);
        if (0 < iVar30) {
          uVar53 = (ulong)(iVar30 + 1);
          do {
            plVar3 = *pplVar55;
            plVar4 = pplVar55[uVar53 - 1];
            pplVar55[uVar53 - 1] = plVar3;
            std::
            __adjust_heap<long_long**,long,long_long*,__gnu_cxx::__ops::_Iter_comp_iter<tinyexr::FHeapCompare>>
                      (pplVar55,0,(long)(uVar53 * 8 + -8) >> 3,plVar4);
            uVar48 = uVar53 - 1;
            plVar4 = *pplVar55;
            pplVar58 = pplVar55 + (uVar53 - 1);
            if (1 < uVar48) {
              plVar5 = pplVar55[uVar53 - 2];
              pplVar55[uVar53 - 2] = plVar4;
              local_160 = pplVar55 + (uVar53 - 1);
              local_128 = uVar48;
              std::
              __adjust_heap<long_long**,long,long_long*,__gnu_cxx::__ops::_Iter_comp_iter<tinyexr::FHeapCompare>>
                        (pplVar55,0,(long)(uVar53 * 8 + -0x10) >> 3,plVar5);
              pplVar58 = local_160;
              uVar48 = local_128;
            }
            uVar40 = (ulong)((long)plVar3 - (long)__s) >> 3;
            uVar49 = (ulong)((long)plVar4 - (long)__s) >> 3;
            plVar14 = (long *)((long)__s + (long)(int)uVar49 * 8);
            *plVar14 = *plVar14 + *(long *)((long)__s + (long)(int)uVar40 * 8);
            plVar14 = pplVar58[-1];
            lVar56 = uVar53 - 2;
            if (1 < uVar48) {
              do {
                lVar41 = (lVar56 - (lVar56 + -1 >> 0x3f)) + -1 >> 1;
                if (*pplVar55[lVar41] <= *plVar14) break;
                pplVar55[lVar56] = pplVar55[lVar41];
                bVar59 = 2 < lVar56;
                lVar56 = lVar41;
              } while (bVar59);
            }
            pplVar55[lVar56] = plVar14;
            do {
              uVar26 = (uint)uVar49;
              lVar56 = (long)(int)uVar26;
              hcode[lVar56] = hcode[lVar56] + 1;
              uVar12 = *(uint *)((long)__s_00 + lVar56 * 4);
              uVar49 = (ulong)uVar12;
            } while (uVar12 != uVar26);
            *(int *)((long)__s_00 + lVar56 * 4) = (int)uVar40;
            do {
              uVar26 = (uint)uVar40;
              hcode[(int)uVar26] = hcode[(int)uVar26] + 1;
              uVar12 = *(uint *)((long)__s_00 + (long)(int)uVar26 * 4);
              uVar40 = (ulong)uVar12;
            } while (uVar12 != uVar26);
            bVar59 = 2 < (long)uVar53;
            pvVar19 = local_c8;
            uVar53 = uVar48;
          } while (bVar59);
        }
        lVar56 = local_108 + 1;
        hufCanonicalCodeTable(hcode);
        memcpy(__s,hcode,0x80008);
        operator_delete(hcode);
        operator_delete(pplVar55);
        operator_delete(__s_00);
        puVar16 = local_90;
        uVar53 = local_150;
        puVar57 = local_90 + 0xc;
        puVar23 = puVar57;
        if ((int)lVar56 < (int)local_a0) {
          uVar49 = 0;
          iVar29 = 0;
        }
        else {
          uVar49 = 0;
          uVar48 = local_a0;
          iVar11 = 0;
          do {
            iVar30 = (int)uVar48;
            lVar41 = (long)iVar30;
            uVar48 = *(ulong *)((long)__s + lVar41 * 8) & 0x3f;
            if (uVar48 == 0) {
              uVar12 = 1;
              if (iVar30 <= (int)local_b0) {
                uVar26 = 1;
                while (uVar12 = uVar26, (*(byte *)((long)__s + lVar41 * 8 + 8) & 0x3f) == 0) {
                  lVar41 = lVar41 + 1;
                  uVar12 = uVar26 + 1;
                  if ((lVar56 <= lVar41) || (bVar59 = 0x103 < uVar26, uVar26 = uVar12, bVar59))
                  break;
                }
                iVar30 = (int)lVar41;
              }
              if (uVar12 < 2) goto LAB_001a1800;
              if (uVar12 < 6) {
                uVar49 = uVar49 << 6 | (ulong)(uVar12 + 0x39);
                iVar29 = iVar11 + 6;
                if (iVar11 < 2) goto LAB_001a183d;
                iVar11 = iVar11 + 0xe;
                do {
                  iVar29 = iVar29 + -8;
                  *(char *)puVar23 = (char)((long)uVar49 >> ((byte)iVar29 & 0x3f));
                  puVar23 = (ushort *)((long)puVar23 + 1);
                  iVar11 = iVar11 + -8;
                } while (0xf < iVar11);
                goto LAB_001a1836;
              }
              iVar46 = iVar11 + 6;
              uVar48 = uVar49 << 6 | 0x3f;
              if (1 < iVar11) {
                iVar11 = iVar11 + 0xe;
                do {
                  iVar29 = iVar11;
                  iVar46 = iVar46 + -8;
                  *(char *)puVar23 = (char)((long)uVar48 >> ((byte)iVar46 & 0x3f));
                  puVar23 = (ushort *)((long)puVar23 + 1);
                  iVar11 = iVar29 + -8;
                } while (0xf < iVar11);
                iVar46 = iVar29 + -0x10;
              }
              uVar49 = uVar48 << 8 | (ulong)(uVar12 - 6);
              iVar29 = iVar46 + 8;
              if (-1 < iVar46) {
                iVar11 = iVar46 + 0x10;
                do {
                  iVar46 = iVar11;
                  iVar29 = iVar29 + -8;
                  *(char *)puVar23 = (char)((long)uVar49 >> ((byte)iVar29 & 0x3f));
                  puVar23 = (ushort *)((long)puVar23 + 1);
                  iVar11 = iVar46 + -8;
                } while (0xf < iVar11);
                iVar29 = iVar46 + -0x10;
              }
            }
            else {
LAB_001a1800:
              uVar49 = uVar48 | uVar49 << 6;
              iVar29 = iVar11 + 6;
              if (1 < iVar11) {
                iVar11 = iVar11 + 0xe;
                do {
                  iVar29 = iVar29 + -8;
                  *(char *)puVar23 = (char)((long)uVar49 >> ((byte)iVar29 & 0x3f));
                  puVar23 = (ushort *)((long)puVar23 + 1);
                  iVar11 = iVar11 + -8;
                } while (0xf < iVar11);
LAB_001a1836:
                iVar29 = iVar11 + -8;
              }
            }
LAB_001a183d:
            uVar48 = (ulong)(iVar30 + 1);
            iVar11 = iVar29;
          } while (iVar30 <= (int)local_b0);
        }
        if (0 < iVar29) {
          *(char *)puVar23 = (char)(uVar49 << (8U - (char)iVar29 & 0x3f));
          puVar23 = (ushort *)((long)puVar23 + 1);
        }
        uVar10 = *local_158;
        puVar42 = puVar23;
        if ((int)(uint)local_a8 < 2) {
          uVar48 = 0;
          iVar30 = 0;
          iVar29 = 0;
        }
        else {
          iVar29 = 0;
          uVar49 = 1;
          iVar30 = 0;
          uVar48 = 0;
          do {
            if (iVar29 < 0xff && uVar10 == local_158[uVar49]) {
              iVar11 = iVar29 + 1;
            }
            else {
              lVar41 = *(long *)((long)__s + (ulong)uVar10 * 8);
              lVar27 = *local_100;
              uVar21 = (uint)lVar41;
              uVar12 = uVar21 & 0x3f;
              uVar33 = (uint)lVar27;
              uVar26 = uVar33 & 0x3f;
              uVar40 = lVar41 >> 6;
              if ((long)((ulong)uVar12 + (ulong)uVar26 + 8) < (long)((ulong)uVar12 * (long)iVar29))
              {
                uVar40 = uVar48 << (sbyte)uVar12 | uVar40;
                iVar30 = (uVar21 & 0x3f) + iVar30;
                iVar46 = iVar30;
                iVar11 = iVar30;
                if (7 < iVar30) {
                  do {
                    *(char *)puVar42 = (char)((long)uVar40 >> ((byte)(iVar46 + -8) & 0x3f));
                    puVar42 = (ushort *)((long)puVar42 + 1);
                    iVar11 = iVar30 + -8;
                    bVar59 = 0xf < iVar30;
                    iVar30 = iVar11;
                    iVar46 = iVar46 + -8;
                  } while (bVar59);
                }
                iVar11 = (uVar33 & 0x3f) + iVar11;
                uVar48 = uVar40 << (sbyte)uVar26 | lVar27 >> 6;
                iVar30 = iVar11;
                iVar46 = iVar11;
                if (7 < iVar11) {
                  do {
                    *(char *)puVar42 = (char)((long)uVar48 >> ((byte)(iVar30 + -8) & 0x3f));
                    puVar42 = (ushort *)((long)puVar42 + 1);
                    iVar46 = iVar11 + -8;
                    bVar59 = 0xf < iVar11;
                    iVar11 = iVar46;
                    iVar30 = iVar30 + -8;
                  } while (bVar59);
                }
                iVar30 = iVar46 + 8;
                uVar48 = uVar48 << 8 | (long)iVar29;
                iVar11 = 0;
                if (-1 < iVar46) {
                  iVar29 = iVar46 + 0x10;
                  do {
                    iVar46 = iVar29;
                    iVar30 = iVar30 + -8;
                    *(char *)puVar42 = (char)((long)uVar48 >> ((byte)iVar30 & 0x3f));
                    puVar42 = (ushort *)((long)puVar42 + 1);
                    iVar29 = iVar46 + -8;
                  } while (0xf < iVar29);
                  iVar30 = iVar46 + -0x10;
                }
              }
              else {
                iVar11 = 0;
                if (-1 < iVar29) {
                  do {
                    iVar30 = iVar30 + (uVar21 & 0x3f);
                    uVar48 = uVar48 << (sbyte)uVar12 | uVar40;
                    iVar39 = iVar30;
                    iVar46 = iVar30;
                    if (7 < iVar30) {
                      do {
                        *(char *)puVar42 = (char)((long)uVar48 >> ((byte)(iVar46 + -8) & 0x3f));
                        puVar42 = (ushort *)((long)puVar42 + 1);
                        iVar30 = iVar39 + -8;
                        bVar59 = 0xf < iVar39;
                        iVar39 = iVar30;
                        iVar46 = iVar46 + -8;
                      } while (bVar59);
                    }
                    bVar59 = 0 < iVar29;
                    iVar29 = iVar29 + -1;
                  } while (bVar59);
                }
              }
            }
            iVar29 = iVar11;
            uVar10 = local_158[uVar49];
            uVar49 = uVar49 + 1;
          } while (uVar49 != ((uint)local_a8 & 0x7fffffff));
        }
        lVar41 = *(long *)((long)__s + (ulong)uVar10 * 8);
        lVar27 = *local_100;
        uVar33 = (uint)lVar41;
        uVar12 = uVar33 & 0x3f;
        uVar21 = (uint)lVar27;
        uVar26 = uVar21 & 0x3f;
        uVar49 = lVar41 >> 6;
        iVar11 = (int)local_148;
        if ((long)((ulong)uVar12 + (ulong)uVar26 + 8) < (long)((ulong)uVar12 * (long)iVar29)) {
          uVar49 = uVar48 << (sbyte)uVar12 | uVar49;
          iVar30 = (uVar33 & 0x3f) + iVar30;
          iVar39 = iVar30;
          iVar46 = iVar30;
          if (7 < iVar30) {
            do {
              *(char *)puVar42 = (char)((long)uVar49 >> ((byte)(iVar39 + -8) & 0x3f));
              puVar42 = (ushort *)((long)puVar42 + 1);
              iVar46 = iVar30 + -8;
              bVar59 = 0xf < iVar30;
              iVar30 = iVar46;
              iVar39 = iVar39 + -8;
            } while (bVar59);
          }
          iVar46 = (uVar21 & 0x3f) + iVar46;
          uVar48 = uVar49 << (sbyte)uVar26 | lVar27 >> 6;
          iVar30 = iVar46;
          iVar39 = iVar46;
          if (7 < iVar46) {
            do {
              *(char *)puVar42 = (char)((long)uVar48 >> ((byte)(iVar30 + -8) & 0x3f));
              puVar42 = (ushort *)((long)puVar42 + 1);
              iVar39 = iVar46 + -8;
              bVar59 = 0xf < iVar46;
              iVar46 = iVar39;
              iVar30 = iVar30 + -8;
            } while (bVar59);
          }
          iVar30 = iVar39 + 8;
          uVar48 = uVar48 << 8 | (long)iVar29;
          if (-1 < iVar39) {
            iVar29 = iVar39 + 0x10;
            do {
              iVar46 = iVar29;
              iVar30 = iVar30 + -8;
              *(char *)puVar42 = (char)((long)uVar48 >> ((byte)iVar30 & 0x3f));
              puVar42 = (ushort *)((long)puVar42 + 1);
              iVar29 = iVar46 + -8;
            } while (0xf < iVar29);
            iVar30 = iVar46 + -0x10;
          }
        }
        else if (-1 < iVar29) {
          do {
            iVar39 = iVar30 + (uVar33 & 0x3f);
            uVar48 = uVar48 << (sbyte)uVar12 | uVar49;
            iVar46 = iVar39;
            iVar30 = iVar39;
            if (7 < iVar39) {
              do {
                *(char *)puVar42 = (char)((long)uVar48 >> ((byte)(iVar46 + -8) & 0x3f));
                puVar42 = (ushort *)((long)puVar42 + 1);
                iVar30 = iVar39 + -8;
                bVar59 = 0xf < iVar39;
                iVar39 = iVar30;
                iVar46 = iVar46 + -8;
              } while (bVar59);
            }
            bVar59 = 0 < iVar29;
            iVar29 = iVar29 + -1;
          } while (bVar59);
        }
        if (iVar30 != 0) {
          *(char *)puVar42 = (char)(uVar48 << (8U - (char)iVar30 & 0x3f));
        }
        iVar39 = (int)puVar42 - (int)puVar23;
        lVar41 = (long)puVar23 - (long)puVar57;
        iVar46 = iVar30 + iVar39 * 8 + 7;
        iVar29 = iVar30 + iVar39 * 8 + 0xe;
        if (-1 < iVar46) {
          iVar29 = iVar46;
        }
        *(char *)(local_90 + 2) = (char)local_a0;
        *(char *)((long)local_90 + 5) = (char)(local_a0 >> 8);
        *(char *)(local_90 + 3) = (char)(local_a0 >> 0x10);
        *(char *)((long)local_90 + 7) = (char)(local_a0 >> 0x18);
        *(char *)(local_90 + 4) = (char)lVar56;
        *(char *)((long)local_90 + 9) = (char)((ulong)lVar56 >> 8);
        *(char *)(local_90 + 5) = (char)((ulong)lVar56 >> 0x10);
        *(char *)((long)local_90 + 0xb) = (char)((ulong)lVar56 >> 0x18);
        *(char *)(local_90 + 6) = (char)lVar41;
        *(char *)((long)local_90 + 0xd) = (char)((ulong)lVar41 >> 8);
        *(char *)(local_90 + 7) = (char)((ulong)lVar41 >> 0x10);
        *(char *)((long)local_90 + 0xf) = (char)((ulong)lVar41 >> 0x18);
        iVar30 = iVar30 + iVar39 * 8;
        *(char *)(local_90 + 8) = (char)iVar30;
        *(char *)((long)local_90 + 0x11) = (char)((uint)iVar30 >> 8);
        *(char *)(local_90 + 9) = (char)((uint)iVar30 >> 0x10);
        *(char *)((long)local_90 + 0x13) = (char)((uint)iVar30 >> 0x18);
        iVar30 = ((iVar29 >> 3) + (int)puVar23) - iVar11;
        local_90[10] = 0;
        local_90[0xb] = 0;
        local_108 = lVar56;
        operator_delete(__s);
      }
      *(int *)puVar16 = iVar30;
      uVar48 = (ulong)(uint)((iVar11 - (int)local_60) + iVar30);
      if (uVar53 <= uVar48) {
        memcpy(local_60,local_68,uVar53);
        uVar48 = uVar53 & 0xffffffff;
      }
      operator_delete(pvVar19);
      pPVar18 = local_e0;
      if (local_120.
          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_120.
                        super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((ushort *)
          local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (ushort *)0x0) {
        operator_delete(local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      operator_delete(pPVar18);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (local_b8,*(undefined8 *)(local_b8 + 8),
                 CONCAT44(local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                          (int)local_80.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start),
                 uVar48 + CONCAT44(local_80.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                   (int)local_80.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start));
      local_120.
      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_80.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                             (int)local_80.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
LAB_001a1be3:
      if (local_120.
          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_120.
                        super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_001a1bed;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0);
LAB_001a1d46:
  uVar20 = std::__throw_out_of_range_fmt
                     ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
                      pPVar18);
  if ((void *)CONCAT44(local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                       (int)local_f8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_f8.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     (int)local_f8.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start));
  }
  _Unwind_Resume(uVar20);
LAB_001a1c23:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_001a1c31:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_001a1c3f:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_001a1c4d:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  goto LAB_001a1c5e;
LAB_001a09d2:
  puVar16 = puVar37 + -1;
LAB_001a099d:
  *(char *)&pPVar31->start = (char)puVar57 - (char)puVar16;
  pPVar31 = (pointer)((long)&pPVar31->start + 1);
  if (puVar57 < puVar16) {
    lVar56 = (long)puVar16 - (long)puVar57;
    do {
      uVar10 = *puVar57;
      puVar57 = (ushort *)((long)puVar57 + 1);
      *(char *)&pPVar31->start = (char)uVar10;
      pPVar31 = (pointer)((long)&pPVar31->start + 1);
      lVar56 = lVar56 + -1;
    } while (lVar56 != 0);
  }
LAB_001a09c4:
  if (puVar23 <= puVar57) goto LAB_001a173e;
  goto LAB_001a08de;
}

Assistant:

static bool EncodePixelData(/* out */ std::vector<unsigned char>& out_data,                         
                            const unsigned char* const* images,
                            int compression_type,
                            int /*line_order*/,
                            int width, // for tiled : tile.width
                            int /*height*/, // for tiled : header.tile_size_y
                            int x_stride, // for tiled : header.tile_size_x
                            int line_no, // for tiled : 0
                            int num_lines, // for tiled : tile.height
                            size_t pixel_data_size,
                            const std::vector<ChannelInfo>& channels,
                            const std::vector<size_t>& channel_offset_list,
                            std::string *err,
                            const void* compression_param = 0) // zfp compression param
{
  size_t buf_size = static_cast<size_t>(width) *
                  static_cast<size_t>(num_lines) *
                  static_cast<size_t>(pixel_data_size);
  //int last2bit = (buf_size & 3);
  // buf_size must be multiple of four
  //if(last2bit) buf_size += 4 - last2bit;
  std::vector<unsigned char> buf(buf_size);

  size_t start_y = static_cast<size_t>(line_no);
  for (size_t c = 0; c < channels.size(); c++) {
    if (channels[c].pixel_type == TINYEXR_PIXELTYPE_HALF) {
      if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          float *line_ptr = reinterpret_cast<float *>(&buf.at(
            static_cast<size_t>(pixel_data_size * size_t(y) * size_t(width)) +
            channel_offset_list[c] *
            static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            tinyexr::FP16 h16;
            h16.u = reinterpret_cast<const unsigned short * const *>(
              images)[c][(y + start_y) * size_t(x_stride) + size_t(x)];

            tinyexr::FP32 f32 = half_to_float(h16);

            tinyexr::swap4(&f32.f);

            // line_ptr[x] = f32.f;
            tinyexr::cpy4(line_ptr + x, &(f32.f));
          }
        }
      } else if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_HALF) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          unsigned short *line_ptr = reinterpret_cast<unsigned short *>(
            &buf.at(static_cast<size_t>(pixel_data_size * y *
                                        width) +
                    channel_offset_list[c] *
                    static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            unsigned short val = reinterpret_cast<const unsigned short * const *>(
              images)[c][(y + start_y) * x_stride + x];

            tinyexr::swap2(&val);

            // line_ptr[x] = val;
            tinyexr::cpy2(line_ptr + x, &val);
          }
        }
      } else {
        if (err) {
          (*err) += "Invalid requested_pixel_type.\n";
        }
        return false;
      }

    } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
      if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_HALF) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          unsigned short *line_ptr = reinterpret_cast<unsigned short *>(
            &buf.at(static_cast<size_t>(pixel_data_size * y *
                                        width) +
                    channel_offset_list[c] *
                    static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            tinyexr::FP32 f32;
            f32.f = reinterpret_cast<const float * const *>(
              images)[c][(y + start_y) * x_stride + x];

            tinyexr::FP16 h16;
            h16 = float_to_half_full(f32);

            tinyexr::swap2(reinterpret_cast<unsigned short *>(&h16.u));

            // line_ptr[x] = h16.u;
            tinyexr::cpy2(line_ptr + x, &(h16.u));
          }
        }
      } else if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          float *line_ptr = reinterpret_cast<float *>(&buf.at(
            static_cast<size_t>(pixel_data_size * y * width) +
            channel_offset_list[c] *
            static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            float val = reinterpret_cast<const float * const *>(
              images)[c][(y + start_y) * x_stride + x];

            tinyexr::swap4(&val);

            // line_ptr[x] = val;
            tinyexr::cpy4(line_ptr + x, &val);
          }
        }
      } else {
        if (err) {
          (*err) += "Invalid requested_pixel_type.\n";
        }
        return false;
      }
    } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_UINT) {
      for (int y = 0; y < num_lines; y++) {
        // Assume increasing Y
        unsigned int *line_ptr = reinterpret_cast<unsigned int *>(&buf.at(
          static_cast<size_t>(pixel_data_size * y * width) +
          channel_offset_list[c] * static_cast<size_t>(width)));
        for (int x = 0; x < width; x++) {
          unsigned int val = reinterpret_cast<const unsigned int * const *>(
            images)[c][(y + start_y) * x_stride + x];

          tinyexr::swap4(&val);

          // line_ptr[x] = val;
          tinyexr::cpy4(line_ptr + x, &val);
        }
      }
    }
  }

  if (compression_type == TINYEXR_COMPRESSIONTYPE_NONE) {
    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(uncompressed)
    out_data.insert(out_data.end(), buf.begin(), buf.end());

  } else if ((compression_type == TINYEXR_COMPRESSIONTYPE_ZIPS) ||
    (compression_type == TINYEXR_COMPRESSIONTYPE_ZIP)) {
#if TINYEXR_USE_MINIZ
    std::vector<unsigned char> block(mz_compressBound(
      static_cast<unsigned long>(buf.size())));
#elif TINYEXR_USE_STB_ZLIB
    // there is no compressBound() function, so we use a value that
    // is grossly overestimated, but should always work
    std::vector<unsigned char> block(256 + 2 * buf.size());
#else
    std::vector<unsigned char> block(
      compressBound(static_cast<uLong>(buf.size())));
#endif
    tinyexr::tinyexr_uint64 outSize = block.size();

    if (!tinyexr::CompressZip(&block.at(0), outSize,
                         reinterpret_cast<const unsigned char *>(&buf.at(0)),
                         static_cast<unsigned long>(buf.size()))) {
      if (err) {
        (*err) += "Zip compresssion failed.\n";
      }
      return false;
    }

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = static_cast<unsigned int>(outSize);  // truncate

    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_RLE) {
    // (buf.size() * 3) / 2 would be enough.
    std::vector<unsigned char> block((buf.size() * 3) / 2);

    tinyexr::tinyexr_uint64 outSize = block.size();

    tinyexr::CompressRle(&block.at(0), outSize,
                         reinterpret_cast<const unsigned char *>(&buf.at(0)),
                         static_cast<unsigned long>(buf.size()));

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = static_cast<unsigned int>(outSize);  // truncate
    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
#if TINYEXR_USE_PIZ
    unsigned int bufLen =
      8192 + static_cast<unsigned int>(
        2 * static_cast<unsigned int>(
          buf.size()));  // @fixme { compute good bound. }
    std::vector<unsigned char> block(bufLen);
    unsigned int outSize = static_cast<unsigned int>(block.size());

    CompressPiz(&block.at(0), &outSize,
                reinterpret_cast<const unsigned char *>(&buf.at(0)),
                buf.size(), channels, width, num_lines);

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = outSize;
    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

#else
    if (err) {
      (*err) += "PIZ compression is disabled in this build.\n";
    }
    return false;
#endif
  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
#if TINYEXR_USE_ZFP
    const ZFPCompressionParam* zfp_compression_param = reinterpret_cast<const ZFPCompressionParam*>(compression_param);
    std::vector<unsigned char> block;
    unsigned int outSize;

    tinyexr::CompressZfp(
      &block, &outSize, reinterpret_cast<const float *>(&buf.at(0)),
      width, num_lines, static_cast<int>(channels.size()), *zfp_compression_param);

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = outSize;
    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

#else
    if (err) {
      (*err) += "ZFP compression is disabled in this build.\n";
    }
    (void)compression_param;
    return false;
#endif
  } else {
    return false;
  }

  return true;
}